

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O2

int32_t __thiscall
icu_63::OlsonTimeZone::getOffset
          (OlsonTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t dom,uint8_t dow,
          int32_t millis,int32_t monthLength,UErrorCode *ec)

{
  SimpleTimeZone *pSVar1;
  uint year_00;
  int iVar2;
  int32_t iVar3;
  undefined8 in_RAX;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000084;
  double dVar4;
  int32_t dstoff;
  int32_t rawoff;
  
  iVar3 = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((dom < 1 || (0xb < (uint)month || 1 < era)) || (monthLength - 0x20U < 0xfffffffc)) ||
        (86399999 < (uint)millis)) || (((byte)(dow - 8) < 0xf9 || (monthLength < dom)))) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      iVar3 = 0;
    }
    else {
      year_00 = -year;
      if (era != '\0') {
        year_00 = year;
      }
      pSVar1 = this->finalZone;
      if ((pSVar1 != (SimpleTimeZone *)0x0) && (this->finalStartYear <= (int)year_00)) {
        iVar2 = (*(pSVar1->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                          (pSVar1,(ulong)era,(ulong)year_00,CONCAT44(in_register_0000000c,month),
                           CONCAT44(in_register_00000084,dom),(ulong)dow);
        return iVar2;
      }
      _dstoff = in_RAX;
      dVar4 = Grego::fieldsToDay(year_00,month,dom);
      getHistoricalOffset(this,dVar4 * 86400000.0 + (double)millis,'\x01',3,1,&rawoff,&dstoff);
      iVar3 = dstoff + rawoff;
    }
  }
  return iVar3;
}

Assistant:

int32_t OlsonTimeZone::getOffset(uint8_t era, int32_t year, int32_t month,
                                 int32_t dom, uint8_t dow,
                                 int32_t millis, int32_t monthLength,
                                 UErrorCode& ec) const {
    if (U_FAILURE(ec)) {
        return 0;
    }

    if ((era != GregorianCalendar::AD && era != GregorianCalendar::BC)
        || month < UCAL_JANUARY
        || month > UCAL_DECEMBER
        || dom < 1
        || dom > monthLength
        || dow < UCAL_SUNDAY
        || dow > UCAL_SATURDAY
        || millis < 0
        || millis >= U_MILLIS_PER_DAY
        || monthLength < 28
        || monthLength > 31) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    if (era == GregorianCalendar::BC) {
        year = -year;
    }

    if (finalZone != NULL && year >= finalStartYear) {
        return finalZone->getOffset(era, year, month, dom, dow,
                                    millis, monthLength, ec);
    }

    // Compute local epoch millis from input fields
    UDate date = (UDate)(Grego::fieldsToDay(year, month, dom) * U_MILLIS_PER_DAY + millis);
    int32_t rawoff, dstoff;
    getHistoricalOffset(date, TRUE, kDaylight, kStandard, rawoff, dstoff);
    return rawoff + dstoff;
}